

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Type in0;
  float afStack_100 [6];
  float local_e8 [4];
  float local_d8 [2];
  ulong local_d0;
  undefined4 local_c8;
  float local_c0 [4];
  float local_b0 [4];
  undefined8 local_a0;
  float local_98;
  float local_94 [3];
  undefined8 uStack_88;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_48;
    lVar2 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar5 != 4);
    local_48 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_38 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_30 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_28 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_18 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_10 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    puVar1 = &local_48;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar5 * 4) = *(undefined4 *)((long)puVar3 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar2 = lVar2 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  puVar1 = &uStack_88;
  uStack_88 = 0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar2 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar2 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar5 != 4);
  puVar1 = &uStack_88;
  puVar4 = &local_48;
  lVar2 = 0;
  do {
    lVar5 = 0;
    do {
      *(uint *)((long)puVar1 + lVar5) = *(uint *)((long)puVar4 + lVar5) ^ 0x80000000;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar2 = lVar2 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar4 = (undefined8 *)((long)puVar4 + 4);
  } while (lVar2 != 4);
  local_a0 = uStack_88;
  local_98 = res_2.m_data[0];
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_b0[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar2 = 0;
  do {
    local_e8[lVar2] = *(float *)((long)&local_a0 + lVar2 * 4) + local_b0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_c0[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d0 = local_d0 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_d8[lVar2] = local_e8[lVar2] + local_c0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_94[0] = 0.0;
  local_94[1] = 0.0;
  local_94[2] = 0.0;
  afStack_100[2] = 0.0;
  afStack_100[3] = 0.0;
  afStack_100[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_100[lVar2 + 2] = local_d8[lVar2] + local_94[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_d0 = 0x100000000;
  local_c8 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_d8[lVar2]] = afStack_100[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}